

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O3

ExactFloat operator*(ExactFloat *a,ExactFloat *b)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BN_CTX *ctx;
  int iVar4;
  ExactFloat *in_RDX;
  BIGNUM *extraout_RDX;
  BIGNUM *extraout_RDX_00;
  int sign;
  ExactFloat EVar6;
  S2LogMessage SStack_38;
  BigNum BVar5;
  
  sign = in_RDX->sign_ * b->sign_;
  iVar2 = b->bn_exp_;
  if (iVar2 < 0x7ffffffd) {
    iVar4 = in_RDX->bn_exp_;
    if (iVar4 < 0x7ffffffd) {
      a->sign_ = 1;
      a->bn_exp_ = 0x7ffffffd;
      pBVar3 = BN_new();
      (a->bn_).bn_ = (BIGNUM *)pBVar3;
      a->sign_ = sign;
      a->bn_exp_ = in_RDX->bn_exp_ + b->bn_exp_;
      ctx = BN_CTX_new();
      iVar2 = BN_mul((BIGNUM *)(a->bn_).bn_,(BIGNUM *)(b->bn_).bn_,(BIGNUM *)(in_RDX->bn_).bn_,ctx);
      if (iVar2 == 0) {
        S2LogMessage::S2LogMessage
                  (&SStack_38,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                   ,0x276,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (SStack_38.stream_,
                   "Check failed: BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx) ",0x41);
        goto LAB_0023393b;
      }
      BN_CTX_free(ctx);
      ExactFloat::Canonicalize(a);
      BVar5.bn_ = extraout_RDX;
      goto LAB_00233868;
    }
LAB_00233855:
    b = in_RDX;
    if (iVar4 != 0x7fffffff) {
      iVar1 = iVar4;
      if ((iVar2 == 0x7ffffffe) || (iVar1 = iVar2, iVar4 == 0x7ffffffe)) {
        if (iVar1 == 0x7ffffffd) {
          EVar6 = ExactFloat::NaN();
          BVar5 = EVar6.bn_.bn_;
        }
        else {
          EVar6 = ExactFloat::Infinity(a,sign);
          BVar5 = EVar6.bn_.bn_;
        }
      }
      else {
        if (iVar4 != 0x7ffffffd && iVar2 != 0x7ffffffd) {
          S2LogMessage::S2LogMessage
                    (&SStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                     ,0x26f,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (SStack_38.stream_,"Check failed: a.is_zero() || b.is_zero() ",0x29);
LAB_0023393b:
          abort();
        }
        EVar6 = ExactFloat::SignedZero(a,sign);
        BVar5 = EVar6.bn_.bn_;
      }
      goto LAB_00233868;
    }
  }
  else if (iVar2 != 0x7fffffff) {
    iVar4 = in_RDX->bn_exp_;
    goto LAB_00233855;
  }
  ExactFloat::ExactFloat(a,b);
  BVar5.bn_ = extraout_RDX_00;
LAB_00233868:
  EVar6.bn_.bn_ = BVar5.bn_;
  EVar6._0_8_ = a;
  return EVar6;
}

Assistant:

ExactFloat operator*(const ExactFloat& a, const ExactFloat& b) {
  int result_sign = a.sign_ * b.sign_;
  if (!a.is_normal() || !b.is_normal()) {
    // Handle zero, infinity, and NaN according to IEEE 754-2008.
    if (a.is_nan()) return a;
    if (b.is_nan()) return b;
    if (a.is_inf()) {
      // Infinity times zero yields NaN.
      if (b.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    if (b.is_inf()) {
      if (a.is_zero()) return ExactFloat::NaN();
      return ExactFloat::Infinity(result_sign);
    }
    S2_DCHECK(a.is_zero() || b.is_zero());
    return ExactFloat::SignedZero(result_sign);
  }
  ExactFloat r;
  r.sign_ = result_sign;
  r.bn_exp_ = a.bn_exp_ + b.bn_exp_;
  BN_CTX* ctx = BN_CTX_new();
  S2_CHECK(BN_mul(r.bn_.get(), a.bn_.get(), b.bn_.get(), ctx));
  BN_CTX_free(ctx);
  r.Canonicalize();
  return r;
}